

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

void Abc_TgFirstPermutation(Abc_TgMan_t *pMan)

{
  char cVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar2 = pMan->nGVars;
  for (lVar3 = 0; lVar3 < iVar2; lVar3 = lVar3 + 1) {
    pMan->pPermDir[lVar3] = -1;
  }
  uVar4 = 0;
  uVar5 = (ulong)(uint)pMan->nGroups;
  if (pMan->nGroups < 1) {
    uVar5 = uVar4;
  }
  do {
    if (uVar5 == uVar4) {
      return;
    }
    cVar1 = pMan->pGroup[uVar4].iStart;
    iVar2 = Abc_TgIsInitPerm(pMan->pPerm + cVar1,pMan->pPermDir + cVar1,
                             (int)pMan->pGroup[uVar4].nGVars);
    uVar4 = uVar4 + 1;
  } while (iVar2 != 0);
  __assert_fail("Abc_TgIsInitPerm(pVars, pDirs, nGvars)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauCanon.c"
                ,0x89f,"void Abc_TgFirstPermutation(Abc_TgMan_t *)");
}

Assistant:

static void Abc_TgFirstPermutation(Abc_TgMan_t * pMan)
{
    int i;
    for (i = 0; i < pMan->nGVars; i++)
        pMan->pPermDir[i] = -1;
#ifndef NDEBUG
    for (i = 0; i < pMan->nGroups; i++)
    {
        TiedGroup * pGrp = pMan->pGroup + i;
        int nGvars = pGrp->nGVars;
        char * pVars = pMan->pPerm + pGrp->iStart;
        signed char * pDirs = pMan->pPermDir + pGrp->iStart;
        assert(Abc_TgIsInitPerm(pVars, pDirs, nGvars));
    }
#endif
}